

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist_queue.h
# Opt level: O0

QueuePtr __thiscall
snmalloc::FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,_0UL>::destroy
          (FreeListMPSCQ<snmalloc::RemoteAllocator::key_global,_0UL> *this)

{
  long in_RDI;
  QueuePtr fnt;
  undefined1 local_130 [4];
  memory_order in_stack_fffffffffffffed4;
  atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
  *in_stack_fffffffffffffed8;
  __pointer_type __p;
  atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
  *this_00;
  __pointer_type local_118 [2];
  __pointer_type local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined4 local_bc;
  long local_b8;
  __pointer_type local_b0;
  __pointer_type local_a8;
  undefined1 local_a0 [8];
  __pointer_type local_98;
  undefined1 *local_90;
  undefined4 local_84;
  __pointer_type local_78;
  __pointer_type local_70;
  undefined1 local_68 [8];
  __pointer_type local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  __pointer_type *local_48;
  undefined4 local_3c;
  long local_38;
  undefined1 local_30 [8];
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 local_10 [8];
  undefined1 *local_8;
  
  local_84 = 0;
  local_118[0] = std::
                 atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
                 ::load(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  local_58 = local_68;
  local_f8 = &stack0xfffffffffffffee0;
  local_100 = 0;
  this_00 = (atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
             *)0x0;
  local_48 = local_118;
  local_50 = &stack0xfffffffffffffee0;
  if (local_118[0] == (__pointer_type)0x0) {
    local_108 = (__pointer_type)0x0;
  }
  else {
    local_b8 = in_RDI + 0x40;
    local_bc = 5;
    local_78 = local_118[0];
    local_70 = local_118[0];
    local_60 = local_118[0];
    local_108 = std::
                atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
                ::load(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    local_90 = local_a0;
    local_d8 = &stack0xfffffffffffffed8;
    local_e0 = 0;
    __p = (__pointer_type)0x0;
    local_1c = 0;
    local_8 = local_10;
    local_b0 = local_108;
    local_a8 = local_108;
    local_98 = local_108;
    std::
    atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
    ::store(this_00,(__pointer_type)0x0,in_stack_fffffffffffffed4);
    local_38 = in_RDI + 0x40;
    local_c8 = local_130;
    local_d0 = 0;
    local_3c = 0;
    local_28 = local_30;
    std::
    atomic<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>_*>
    ::store(this_00,__p,relaxed);
  }
  return (QueuePtr)local_108;
}

Assistant:

freelist::QueuePtr destroy()
    {
      if (back.load(stl::memory_order_relaxed) == nullptr)
        return nullptr;

      freelist::QueuePtr fnt = front.load();
      back.store(nullptr, stl::memory_order_relaxed);
      front.store(nullptr, stl::memory_order_relaxed);
      return fnt;
    }